

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

type_conflict2 jsteemann::atoi<unsigned_long>(char *p,char *e,int *errcode)

{
  byte bVar1;
  unsigned_long uVar2;
  type_conflict2 tVar3;
  int iVar4;
  
  if (p == e) {
    *errcode = -1;
  }
  else {
    if (*p != '-') {
      if (*p == '+') {
        uVar2 = atoi_positive<unsigned_long>(p + 1,e,errcode);
        return uVar2;
      }
      iVar4 = -1;
      if (p == e) {
        tVar3 = 0;
        iVar4 = -1;
      }
      else {
        tVar3 = 0;
        do {
          bVar1 = *p;
          if (((ulong)bVar1 < 0x21) && ((0x100003e01U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
          if ((byte)(bVar1 - 0x3a) < 0xf6) goto LAB_002f88c5;
          if ((0x1999999999999999 < tVar3) ||
             (tVar3 == 0x1999999999999999 && 5 < (byte)(bVar1 - 0x30))) {
            iVar4 = -3;
            goto LAB_002f88c5;
          }
          tVar3 = (ulong)(byte)(bVar1 - 0x30) + tVar3 * 10;
          p = (char *)((byte *)p + 1);
        } while (p < e);
        iVar4 = 0;
      }
LAB_002f88c5:
      *errcode = iVar4;
      return tVar3;
    }
    *errcode = -2;
  }
  return 0;
}

Assistant:

inline typename std::enable_if<std::is_unsigned<T>::value, T>::type atoi(char const* p, char const* e, int &errcode) JSTEEMANN_NOEXCEPT {
  if (ATOI_UNLIKELY(p == e)) {
    errcode = -1;
    return T();
  }

  if (*p == '-') {
    errcode = -2;
    return T();
  }
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }

  return atoi_positive<T>(p, e, errcode);
}